

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::TrustTokenBadKeyTest_BadKey_Test::TestBody
          (TrustTokenBadKeyTest_BadKey_Test *this)

{
  trust_token_issuer_st *ptVar1;
  _func_int **pp_Var2;
  TRUST_TOKEN_ISSUER *ctx;
  uint8_t *request;
  bool bVar3;
  int iVar4;
  ParamType *pPVar5;
  char *in_R9;
  char *pcVar6;
  pointer *__ptr;
  undefined1 auVar7 [16];
  Message local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  UniquePtr<uint8_t> free_issue_msg;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AssertHelper local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  UniquePtr<uint8_t> free_msg;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  size_t key_index;
  uint8_t *issue_msg;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  size_t msg_len;
  uint8_t *issue_resp;
  size_t resp_len;
  size_t tokens_issued;
  
  if (((this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.method_)->
      has_private_metadata == 0) {
    pPVar5 = testing::
             WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::
             GetParam();
    if ((pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
        super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
        super__Head_base<2UL,_bool,_false>._M_head_impl != false) {
      return;
    }
    pPVar5 = testing::
             WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::
             GetParam();
    if ((pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
        super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl != 4) {
      return;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) {
LAB_0038cc44:
    testing::Message::Message((Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x4bd,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_c8,(Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
      (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface + 8))();
    }
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            (&gtest_fatal_failure_checker);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
  }
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            (&gtest_fatal_failure_checker);
  if (gtest_fatal_failure_checker.has_new_fatal_failure_ == true) goto LAB_0038cc44;
  issue_msg = (uint8_t *)0x0;
  issue_resp = (uint8_t *)0x0;
  if ((this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.use_msg_ == true) {
    pcVar6 = &DAT_00000004;
    iVar4 = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                      ((this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10,"MSG",4);
    local_c8[0] = (internal)(iVar4 != 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)local_c8,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                 ,"false","true",pcVar6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&free_issue_msg,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x4c3,(char *)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                _vptr_TestPartResultReporterInterface);
      testing::internal::AssertHelper::operator=((AssertHelper *)&free_issue_msg,&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&free_issue_msg);
      if ((TestPartResultReporterInterface **)
          gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_)
      {
        operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface,
                        (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                       _vptr_TestPartResultReporterInterface + 1));
      }
      if ((long *)CONCAT71(local_e0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_e0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_e0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_e0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
joined_r0x0038d146:
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
      return;
    }
  }
  else {
    iVar4 = TRUST_TOKEN_CLIENT_begin_issuance
                      ((this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10);
    local_c8[0] = (internal)(iVar4 != 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)local_c8,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&free_issue_msg,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x4c6,(char *)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                _vptr_TestPartResultReporterInterface);
      testing::internal::AssertHelper::operator=((AssertHelper *)&free_issue_msg,&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&free_issue_msg);
      if ((TestPartResultReporterInterface **)
          gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_)
      {
        operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface,
                        (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                       _vptr_TestPartResultReporterInterface + 1));
      }
      if ((long *)CONCAT71(local_e0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_e0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_e0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_e0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      goto joined_r0x0038d146;
    }
  }
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_msg;
  ptVar1 = (this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.issuer._M_t.
           super___uniq_ptr_impl<trust_token_issuer_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_trust_token_issuer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_trust_token_issuer_st_*,_false>._M_head_impl;
  auVar7._8_4_ = (int)ptVar1;
  auVar7._0_8_ = ptVar1;
  auVar7._12_4_ = (int)((ulong)ptVar1 >> 0x20);
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface = (_func_int **)&ptVar1->keys[0].key;
  gtest_fatal_failure_checker._8_8_ = auVar7._8_8_ + 0x60;
  gtest_fatal_failure_checker.original_reporter_ =
       (TestPartResultReporterInterface *)((long)&ptVar1->keys[0].key + 0x90);
  pPVar5 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
           ::GetParam();
  request = issue_msg;
  pp_Var2 = (&gtest_fatal_failure_checker.super_TestPartResultReporterInterface)
            [(pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
             super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
             super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl].
            _vptr_TestPartResultReporterInterface;
  *pp_Var2 = (_func_int *)((ulong)*pp_Var2 ^ 0x2a);
  ctx = (this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.issuer._M_t.
        super___uniq_ptr_impl<trust_token_issuer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_trust_token_issuer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_trust_token_issuer_st_*,_false>._M_head_impl;
  pPVar5 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
           ::GetParam();
  iVar4 = TRUST_TOKEN_ISSUER_issue
                    (ctx,&issue_resp,&resp_len,&tokens_issued,request,msg_len,7,
                     (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>
                     ).super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
                     super__Head_base<2UL,_bool,_false>._M_head_impl,1);
  local_e0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(iVar4 != 0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar4 == 0) {
    testing::Message::Message((Message *)&free_msg);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_e0,
               (AssertionResult *)
               "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, 7, private_metadata(), 1)"
               ,"false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key_index,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x4d4,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,(Message *)&free_msg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
        free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)free_msg._M_t.
                            super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    goto LAB_0038d230;
  }
  free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_resp;
  tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_TRUST_TOKEN,_bssl::internal::Deleter,_true,_true>)
       TRUST_TOKEN_CLIENT_finish_issuance
                 ((this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.client._M_t.
                  super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,&key_index,
                  issue_resp,resp_len);
  pPVar5 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
           ::GetParam();
  pcVar6 = (char *)msg_len;
  if ((((pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
        super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
        super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl + 1U < 3) &&
      (pPVar5 = testing::
                WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::
                GetParam(), pcVar6 = (char *)msg_len,
      (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
      super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
      super__Head_base<2UL,_bool,_false>._M_head_impl != false)) ||
     ((pPVar5 = testing::
                WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::
                GetParam(),
      ((pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
       super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
       super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl & 0xfffffffeU) ==
      2 && (pPVar5 = testing::
                     WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
                     ::GetParam(),
           (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
           super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.
           super__Head_base<2UL,_bool,_false>._M_head_impl == false)))) {
    local_e0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ =
         (internal)
         ((__uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>)
          tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_e0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_e0,(AssertionResult *)"tokens","false","true"
                 ,pcVar6);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x4de,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
      }
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
      goto joined_r0x0038d212;
    }
  }
  else {
    local_e0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ =
         (internal)
         ((__uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>)
          tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl ==
         (__uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_e0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_e0,(AssertionResult *)"tokens","true","false"
                 ,pcVar6);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x4e0,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
      }
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
joined_r0x0038d212:
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
    }
  }
  std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr(&tokens);
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_msg);
LAB_0038d230:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_issue_msg);
  return;
}

Assistant:

TEST_P(TrustTokenBadKeyTest, BadKey) {
  // For versions without private metadata, only corruptions of 'xs' (the 4th
  // entry in |scalars| below) result in a bad key, as the other scalars are
  // unused internally.
  if (!method()->has_private_metadata &&
      (private_metadata() || corrupted_key() != 4)) {
    return;
  }

  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);

  struct trust_token_issuer_key_st *key = &issuer->keys[0];
  EC_SCALAR *scalars[] = {&key->key.x0, &key->key.y0, &key->key.x1,
                          &key->key.y1, &key->key.xs, &key->key.ys};

  // Corrupt private key scalar.
  scalars[corrupted_key()]->words[0] ^= 42;

  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      /*public_metadata=*/7, private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);
  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, issue_resp,
                                         resp_len));

  // If the unused private key is corrupted, then the DLEQ proof should succeed.
  if ((corrupted_key() / 2 == 0 && private_metadata() == true) ||
      (corrupted_key() / 2 == 1 && private_metadata() == false)) {
    ASSERT_TRUE(tokens);
  } else {
    ASSERT_FALSE(tokens);
  }
}